

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_revisiondate(lysp_yang_ctx *ctx,char *rev,lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  char *pcVar2;
  ly_ctx *local_78;
  ly_ctx *local_68;
  ly_ctx *local_60;
  bool local_51;
  LY_ERR ret___1;
  ly_stmt lStack_4c;
  ly_bool __loop_end;
  LY_ERR ret__;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_ext_instance **pplStack_28;
  LY_ERR ret;
  lysp_ext_instance **exts_local;
  char *rev_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_28 = exts;
  exts_local = (lysp_ext_instance **)rev;
  rev_local = (char *)ctx;
  if (*rev != '\0') {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_60 = (ly_ctx *)0x0;
    }
    else {
      local_60 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","revision-date");
    return LY_EVALID;
  }
  LVar1 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,(char **)&word_len,&word,(size_t *)&ret__);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  LVar1 = lysp_check_date((lysp_ctx *)rev_local,(char *)word_len,_ret__,"revision-date");
  if (LVar1 != LY_SUCCESS) {
    free(word);
    return LY_EVALID;
  }
  strncpy((char *)exts_local,(char *)word_len,_ret__);
  free(word);
  buf._4_4_ = get_keyword((lysp_yang_ctx *)rev_local,&stack0xffffffffffffffb4,(char **)&word_len,
                          (size_t *)&ret__);
  if (buf._4_4_ == LY_SUCCESS) {
    if (lStack_4c == LY_STMT_SYNTAX_SEMICOLON) {
      local_51 = true;
    }
    else {
      if (lStack_4c != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (rev_local == (char *)0x0) {
          local_68 = (ly_ctx *)0x0;
        }
        else {
          local_68 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(*(long *)(rev_local + 0x38) + 8) +
                        (ulong)(*(int *)(*(long *)(rev_local + 0x38) + 4) - 1) * 8);
        }
        pcVar2 = lyplg_ext_stmt2str(lStack_4c);
        ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
        return LY_EVALID;
      }
      LVar1 = get_keyword((lysp_yang_ctx *)rev_local,&stack0xffffffffffffffb4,(char **)&word_len,
                          (size_t *)&ret__);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      local_51 = lStack_4c == LY_STMT_SYNTAX_RIGHT_BRACE;
    }
    while( true ) {
      buf._4_4_ = 0;
      if (local_51) {
        return LY_SUCCESS;
      }
      if (lStack_4c != LY_STMT_EXTENSION_INSTANCE) {
        if (rev_local == (char *)0x0) {
          local_78 = (ly_ctx *)0x0;
        }
        else {
          local_78 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(*(long *)(rev_local + 0x38) + 8) +
                        (ulong)(*(int *)(*(long *)(rev_local + 0x38) + 4) - 1) * 8);
        }
        pcVar2 = lyplg_ext_stmt2str(lStack_4c);
        ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                ,pcVar2,"revision-date");
        return LY_EVALID;
      }
      LVar1 = parse_ext((lysp_yang_ctx *)rev_local,(char *)word_len,_ret__,exts_local,
                        LY_STMT_REVISION_DATE,0,pplStack_28);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      LVar1 = get_keyword((lysp_yang_ctx *)rev_local,&stack0xffffffffffffffb4,(char **)&word_len,
                          (size_t *)&ret__);
      if (LVar1 != LY_SUCCESS) break;
      if (lStack_4c == LY_STMT_SYNTAX_RIGHT_BRACE) {
        local_51 = true;
      }
    }
    return LVar1;
  }
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_revisiondate(struct lysp_yang_ctx *ctx, char *rev, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (rev[0]) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "revision-date");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    /* check value */
    if (lysp_check_date((struct lysp_ctx *)ctx, word, word_len, "revision-date")) {
        free(buf);
        return LY_EVALID;
    }

    /* store value and spend buf if allocated */
    strncpy(rev, word, word_len);
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, rev, LY_STMT_REVISION_DATE, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "revision-date");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}